

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O2

bool __thiscall
cmCPackNSISGenerator::GetListOfSubdirectories
          (cmCPackNSISGenerator *this,char *topdir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  string *psVar4;
  unsigned_long i;
  ulong dindex;
  Directory dir;
  string fullPath;
  allocator<char> local_91;
  Directory local_90;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_88;
  cmCPackNSISGenerator *local_80;
  char *local_78;
  string local_70;
  allocator<char> local_50 [32];
  
  local_88 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dirs;
  local_80 = this;
  local_78 = topdir;
  cmsys::Directory::Directory(&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,topdir,local_50);
  cmsys::Directory::Load(&local_90,&local_70,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  dindex = 0;
  while( true ) {
    uVar2 = cmsys::Directory::GetNumberOfFiles(&local_90);
    if (uVar2 <= dindex) break;
    pcVar3 = cmsys::Directory::GetFile(&local_90,dindex);
    if ((*pcVar3 != '.') || ((pcVar3[1] != '\0' && ((pcVar3[1] != '.' || (pcVar3[2] != '\0')))))) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,topdir,&local_91);
      pcVar3 = (char *)std::__cxx11::string::append((char *)local_50);
      psVar4 = (string *)std::__cxx11::string::append(pcVar3);
      std::__cxx11::string::string((string *)&local_70,psVar4);
      std::__cxx11::string::~string((string *)local_50);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_70);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsSymlink(&local_70);
        if (!bVar1) {
          GetListOfSubdirectories
                    (local_80,local_70._M_dataplus._M_p,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88);
        }
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
    dindex = dindex + 1;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            (local_88,&local_78);
  cmsys::Directory::~Directory(&local_90);
  return true;
}

Assistant:

bool cmCPackNSISGenerator::GetListOfSubdirectories(
  const char* topdir, std::vector<std::string>& dirs)
{
  cmsys::Directory dir;
  dir.Load(topdir);
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      std::string const fullPath =
        std::string(topdir).append("/").append(fileName);
      if (cmsys::SystemTools::FileIsDirectory(fullPath) &&
          !cmsys::SystemTools::FileIsSymlink(fullPath)) {
        if (!this->GetListOfSubdirectories(fullPath.c_str(), dirs)) {
          return false;
        }
      }
    }
  }
  dirs.emplace_back(topdir);
  return true;
}